

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

ServiceClient __thiscall
miniros::NodeHandle::serviceClient(NodeHandle *this,ServiceClientOptions *ops)

{
  void *pvVar1;
  vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
  *this_00;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  ServiceClient SVar3;
  ServiceClient *unaff_retaddr;
  scoped_lock<std::mutex> lock;
  ServiceClient *client;
  mutex_type *in_stack_ffffffffffffff58;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff60;
  bool in_stack_ffffffffffffffaf;
  string *in_stack_ffffffffffffffb0;
  NodeHandle *in_stack_ffffffffffffffb8;
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  long lVar4;
  undefined1 persistent;
  element_type *service_name;
  
  lVar4 = in_RSI;
  service_name = in_RDI;
  resolveName(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  persistent = (undefined1)((ulong)lVar4 >> 0x38);
  std::__cxx11::string::operator=(in_RDX,local_38);
  std::__cxx11::string::~string(local_38);
  ServiceClient::ServiceClient
            (unaff_retaddr,(string *)service_name,(bool)persistent,(M_string *)in_RDX,
             in_stack_ffffffffffffffe0);
  pvVar1 = ServiceClient::operator_cast_to_void_((ServiceClient *)0x479297);
  _Var2._M_pi = extraout_RDX;
  if (pvVar1 != (void *)0x0) {
    std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = (vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
               *)(*(long *)(in_RSI + 0xa8) + 0x48);
    std::weak_ptr<miniros::ServiceClient::Impl>::weak_ptr<miniros::ServiceClient::Impl,void>
              ((weak_ptr<miniros::ServiceClient::Impl> *)this_00,
               (shared_ptr<miniros::ServiceClient::Impl> *)in_stack_ffffffffffffff58);
    std::
    vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
    ::push_back(this_00,(value_type *)in_stack_ffffffffffffff58);
    std::weak_ptr<miniros::ServiceClient::Impl>::~weak_ptr
              ((weak_ptr<miniros::ServiceClient::Impl> *)0x47930d);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x479317);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  SVar3.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (ServiceClient)
         SVar3.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceClient NodeHandle::serviceClient(ServiceClientOptions& ops)
{
  ops.service = resolveName(ops.service);
  ServiceClient client(ops.service, ops.persistent, ops.header, ops.md5sum);

  if (client)
  {
    std::scoped_lock<std::mutex> lock(collection_->mutex_);
    collection_->srv_cs_.push_back(client.impl_);
  }

  return client;
}